

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsioContextManager.cpp
# Opt level: O0

LoopHandle gmlc::networking::AsioContextManager::runContextLoop(string *contextName)

{
  bool bVar1;
  invalid_argument *this;
  __uniq_ptr_data<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>,_true,_true>
  in_RDI;
  shared_ptr<gmlc::networking::AsioContextManager> ptr;
  iterator fnd;
  unique_lock<std::mutex> ctxlock;
  AsioContextManager *in_stack_00000118;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
  *in_stack_ffffffffffffff88;
  unique_lock<std::mutex> *in_stack_ffffffffffffff90;
  _Self local_40 [3];
  _Self local_28 [5];
  
  std::unique_lock<std::mutex>::unique_lock
            (in_stack_ffffffffffffff90,(mutex_type *)in_stack_ffffffffffffff88);
  local_28[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
       ::find(in_stack_ffffffffffffff88,(key_type *)0x6e9a8d);
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>_>
       ::end(in_stack_ffffffffffffff88);
  bVar1 = std::operator==(local_28,local_40);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"the context name specified was not available");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>
  ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<gmlc::networking::AsioContextManager>_>_>
                *)0x6e9ad3);
  std::shared_ptr<gmlc::networking::AsioContextManager>::shared_ptr
            ((shared_ptr<gmlc::networking::AsioContextManager> *)in_stack_ffffffffffffff90,
             (shared_ptr<gmlc::networking::AsioContextManager> *)in_stack_ffffffffffffff88);
  std::unique_lock<std::mutex>::unlock(in_stack_ffffffffffffff90);
  std::
  __shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  ::operator->((__shared_ptr_access<gmlc::networking::AsioContextManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x6e9afa);
  startContextLoop(in_stack_00000118);
  std::shared_ptr<gmlc::networking::AsioContextManager>::~shared_ptr
            ((shared_ptr<gmlc::networking::AsioContextManager> *)0x6e9b13);
  std::unique_lock<std::mutex>::~unique_lock(in_stack_ffffffffffffff90);
  return (__uniq_ptr_data<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>,_true,_true>
          )(tuple<gmlc::networking::AsioContextManager::Servicer_*,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
            )in_RDI.
             super___uniq_ptr_impl<gmlc::networking::AsioContextManager::Servicer,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
             ._M_t.
             super__Tuple_impl<0UL,_gmlc::networking::AsioContextManager::Servicer_*,_std::default_delete<gmlc::networking::AsioContextManager::Servicer>_>
             .super__Head_base<0UL,_gmlc::networking::AsioContextManager::Servicer_*,_false>.
             _M_head_impl;
}

Assistant:

AsioContextManager::LoopHandle
    AsioContextManager::runContextLoop(const std::string& contextName)
{
    std::unique_lock<std::mutex> ctxlock(contextLock);
    auto fnd = contexts.find(contextName);
    if (fnd != contexts.end()) {
        auto ptr = fnd->second;
        ctxlock.unlock();
        return ptr->startContextLoop();
    }
    throw(
        std::invalid_argument("the context name specified was not available"));
}